

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void cf_poly1305_init(cf_poly1305 *ctx,uint8_t *r,uint8_t *s)

{
  undefined8 uVar1;
  
  memset(ctx,0,0xb0);
  ctx->r[0] = (uint)*r;
  ctx->r[1] = (uint)r[1];
  ctx->r[2] = (uint)r[2];
  ctx->r[3] = r[3] & 0xf;
  ctx->r[4] = r[4] & 0xfffffffc;
  ctx->r[5] = (uint)r[5];
  ctx->r[6] = (uint)r[6];
  ctx->r[7] = r[7] & 0xf;
  ctx->r[8] = r[8] & 0xfffffffc;
  ctx->r[9] = (uint)r[9];
  ctx->r[10] = (uint)r[10];
  ctx->r[0xb] = r[0xb] & 0xf;
  ctx->r[0xc] = r[0xc] & 0xfffffffc;
  ctx->r[0xd] = (uint)r[0xd];
  ctx->r[0xe] = (uint)r[0xe];
  ctx->r[0xf] = r[0xf] & 0xf;
  ctx->r[0x10] = 0;
  uVar1 = *(undefined8 *)(s + 8);
  *(undefined8 *)ctx->s = *(undefined8 *)s;
  *(undefined8 *)(ctx->s + 8) = uVar1;
  return;
}

Assistant:

void cf_poly1305_init(cf_poly1305 *ctx,
                      const uint8_t r[16],
                      const uint8_t s[16])
{
  memset(ctx, 0, sizeof *ctx);

  ctx->r[0]  = r[0];
  ctx->r[1]  = r[1];
  ctx->r[2]  = r[2];
  ctx->r[3]  = r[3] & 0x0f;
  ctx->r[4]  = r[4] & 0xfc;
  ctx->r[5]  = r[5];
  ctx->r[6]  = r[6];
  ctx->r[7]  = r[7] & 0x0f;
  ctx->r[8]  = r[8] & 0xfc;
  ctx->r[9]  = r[9];
  ctx->r[10] = r[10];
  ctx->r[11] = r[11] & 0x0f;
  ctx->r[12] = r[12] & 0xfc;
  ctx->r[13] = r[13];
  ctx->r[14] = r[14];
  ctx->r[15] = r[15] & 0x0f;
  ctx->r[16] = 0;

  memcpy(ctx->s, s, 16);
}